

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  undefined8 uVar1;
  ssize_t sVar2;
  FTP *data_00;
  size_t sVar3;
  char *pcVar4;
  curltime cVar5;
  size_t local_90;
  undefined4 uStack_74;
  long old_time;
  size_t dlen;
  size_t flen;
  char *path;
  CURLcode result;
  int ftpcode;
  ssize_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  _Bool premature_local;
  connectdata *pcStack_18;
  CURLcode status_local;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((Curl_easy *)ftp)->req).protop;
  nread = (ssize_t)&conn->proto;
  path._0_4_ = CURLE_OK;
  flen = 0;
  if (ftpc == (ftp_conn *)0x0) {
    return CURLE_OK;
  }
  pp = (pingpong *)nread;
  data._3_1_ = premature;
  data._4_4_ = status;
  pcStack_18 = conn;
  switch(status) {
  case CURLE_OK:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_PARTIAL_FILE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_WRITE_ERROR:
  case CURLE_UPLOAD_FAILED:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
    if (!premature) goto LAB_0082ff90;
  }
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = true;
  Curl_conncontrol(conn,1);
  path._0_4_ = data._4_4_;
LAB_0082ff90:
  (*Curl_cfree)((void *)pp[1].sendleft);
  if ((*(ushort *)&ftp[0x72].field_0x24 >> 7 & 1) != 0) {
    if ((ftp[0x4c].passwd != (char *)0x0) && (pp[1].linestart_resp != (char *)0x0)) {
      Curl_set_in_callback((Curl_easy *)ftp,true);
      (*(code *)ftp[0x4c].passwd)(ftp[0x74].path);
      Curl_set_in_callback((Curl_easy *)ftp,false);
    }
    pp[1].endofresp = (_func__Bool_connectdata_ptr_char_ptr_size_t_int_ptr *)0xffffffffffffffff;
  }
  if ((CURLcode)path == CURLE_OK) {
    path._0_4_ = Curl_urldecode((Curl_easy *)ftp,(char *)(ftpc->pp).nread_resp,0,(char **)&flen,
                                (size_t *)0x0,true);
  }
  if ((CURLcode)path == CURLE_OK) {
    if (pp[1].linestart_resp == (char *)0x0) {
      local_90 = 0;
    }
    else {
      local_90 = strlen(pp[1].linestart_resp);
    }
    sVar3 = strlen((char *)flen);
    if (((ulong)pp[1].sendthis & 1) == 0) {
      *(undefined4 *)&pp[1].sendsize = *(undefined4 *)&ftp[0x3f].path;
      if ((sVar3 - local_90 == 0) || (*(int *)&ftp[0x3f].path == 2)) {
        (*Curl_cfree)((void *)flen);
        pcVar4 = (*Curl_cstrdup)("");
        pp[1].sendleft = (size_t)pcVar4;
        if (pp[1].sendleft == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pp[1].sendleft = flen;
        if (local_90 != 0) {
          *(undefined1 *)(pp[1].sendleft + (sVar3 - local_90)) = 0;
        }
      }
      if (pp[1].sendleft != 0) {
        Curl_infof((Curl_easy *)ftp,"Remembering we are in dir \"%s\"\n",pp[1].sendleft);
      }
    }
    else {
      pp[1].sendleft = 0;
      (*Curl_cfree)((void *)flen);
    }
  }
  else {
    pp[1].field_0x21 = 0;
    Curl_conncontrol(pcStack_18,1);
    pp[1].sendleft = 0;
  }
  freedirs((ftp_conn *)pp);
  if (pcStack_18->sock[1] != -1) {
    if (((((CURLcode)path == CURLE_OK) && ((pp[1].pending_resp & 1U) != 0)) &&
        (0 < (long)ftp[5].passwd)) &&
       (path._0_4_ = Curl_pp_sendf((pingpong *)nread,"%s","ABOR"), data_00 = ftp,
       (CURLcode)path != CURLE_OK)) {
      pcVar4 = curl_easy_strerror((CURLcode)path);
      Curl_failf((Curl_easy *)data_00,"Failure sending ABOR command: %s",pcVar4);
      pp[1].field_0x21 = 0;
      Curl_conncontrol(pcStack_18,1);
    }
    if ((pcStack_18->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(pcStack_18,1);
    }
    close_secondarysocket(pcStack_18);
  }
  sVar2 = nread;
  if ((((CURLcode)path == CURLE_OK) && (*(int *)&(ftpc->pp).pending_resp == 0)) &&
     (((pp[1].field_0x21 & 1) != 0 &&
      (((*(byte *)(nread + 0x20) & 1) != 0 && ((data._3_1_ & 1) == 0)))))) {
    uVar1 = *(undefined8 *)(nread + 0x50);
    *(undefined8 *)(nread + 0x50) = 60000;
    cVar5 = Curl_now();
    *(time_t *)(sVar2 + 0x40) = cVar5.tv_sec;
    *(ulong *)(sVar2 + 0x48) = CONCAT44(uStack_74,cVar5.tv_usec);
    path._0_4_ = Curl_GetFTPResponse((ssize_t *)&result,pcStack_18,(int *)((long)&path + 4));
    *(undefined8 *)(nread + 0x50) = uVar1;
    if ((_result == 0) && ((CURLcode)path == CURLE_OPERATION_TIMEDOUT)) {
      Curl_failf((Curl_easy *)ftp,"control connection looks dead");
      pp[1].field_0x21 = 0;
      Curl_conncontrol(pcStack_18,1);
    }
    if ((CURLcode)path != CURLE_OK) {
      return (CURLcode)path;
    }
    if (((pp[1].pending_resp & 1U) != 0) && (0 < (long)ftp[5].passwd)) {
      Curl_infof((Curl_easy *)ftp,"partial download completed, closing connection\n");
      Curl_conncontrol(pcStack_18,1);
      return (CURLcode)path;
    }
    if ((((pp[1].pending_resp & 1U) == 0) && (path._4_4_ != 0xe2)) && (path._4_4_ != 0xfa)) {
      Curl_failf((Curl_easy *)ftp,"server did not report OK, got %d",(ulong)path._4_4_);
      path._0_4_ = CURLE_PARTIAL_FILE;
    }
  }
  if (((CURLcode)path == CURLE_OK) && ((data._3_1_ & 1) == 0)) {
    if (((ulong)ftp[0x4f].path >> 0x1d & 1) == 0) {
      if (((ftp[5].user == (char *)0xffffffffffffffff) || (ftp[5].user == ftp[5].path)) ||
         ((ftp[5].user + ftp[0x6e].downloadsize == ftp[5].path || (ftp[5].passwd == ftp[5].path))))
      {
        if ((((pp[1].pending_resp & 1U) == 0) && (ftp[5].path == (char *)0x0)) &&
           (0 < (long)ftp[5].user)) {
          Curl_failf((Curl_easy *)ftp,"No data was received!");
          path._0_4_ = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf((Curl_easy *)ftp,"Received only partial file: %ld bytes",ftp[5].path);
        path._0_4_ = CURLE_PARTIAL_FILE;
      }
    }
    else if (((ftp[0x6f].downloadsize != -1) && ((char *)ftp[0x6f].downloadsize != ftp[5].pathalloc)
             ) && ((((ulong)ftp[0x4f].path >> 6 & 1) == 0 && (*(int *)&(ftpc->pp).pending_resp == 0)
                   ))) {
      Curl_failf((Curl_easy *)ftp,"Uploaded unaligned file size (%ld out of %ld bytes)",ftp[5].path,
                 ftp[0x6f].downloadsize);
      path._0_4_ = CURLE_PARTIAL_FILE;
    }
  }
  *(undefined4 *)&(ftpc->pp).pending_resp = 0;
  pp[1].pending_resp = false;
  if (((data._4_4_ == CURLE_OK) && ((CURLcode)path == CURLE_OK)) &&
     (((data._3_1_ & 1) == 0 && (ftp[0x34].downloadsize != 0)))) {
    path._0_4_ = ftp_sendquote(pcStack_18,(curl_slist *)ftp[0x34].downloadsize);
  }
  (*Curl_cfree)((ftpc->pp).linestart_resp);
  (ftpc->pp).linestart_resp = (char *)0x0;
  return (CURLcode)path;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *path = NULL;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  /* now store a copy of the directory we are in */
  free(ftpc->prevpath);

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &path, NULL, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else {
    size_t flen = ftpc->file?strlen(ftpc->file):0; /* file is "raw" already */
    size_t dlen = strlen(path)-flen;
    if(!ftpc->cwdfail) {
      ftpc->prevmethod = data->set.ftp_filemethod;
      if(dlen && (data->set.ftp_filemethod != FTPFILE_NOCWD)) {
        ftpc->prevpath = path;
        if(flen)
          /* if 'path' is not the whole string */
          ftpc->prevpath[dlen] = 0; /* terminate */
      }
      else {
        free(path);
        /* we never changed dir */
        ftpc->prevpath = strdup("");
        if(!ftpc->prevpath)
          return CURLE_OUT_OF_MEMORY;
      }
      if(ftpc->prevpath)
        infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
    }
    else {
      ftpc->prevpath = NULL; /* no path */
      free(path);
    }
  }
  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}